

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O0

int __thiscall
ncnn::GRU::forward(GRU *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference __fn;
  void *__src;
  void *__dest;
  reference pvVar5;
  long in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  void *in_R8;
  bool bVar6;
  float *ptr_1;
  float *pr;
  float *pf;
  int i_1;
  int ret1;
  Mat hidden1;
  int ret0;
  Mat hidden0;
  Mat top_blob_reverse;
  Mat top_blob_forward;
  int ret;
  Mat *top_blob;
  Allocator *hidden_allocator;
  Mat hidden;
  int num_directions;
  int T;
  Mat *bottom_blob;
  int i;
  float *ptr;
  int size;
  Mat *m_8;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_ffffffffffffee48;
  size_t in_stack_ffffffffffffee50;
  value_type *pvVar7;
  undefined8 in_stack_ffffffffffffee58;
  Mat *in_stack_ffffffffffffee60;
  reference pvVar8;
  bool local_1009;
  bool local_fe9;
  Mat *in_stack_fffffffffffff020;
  Mat *in_stack_fffffffffffff028;
  Mat *in_stack_fffffffffffff030;
  void **in_stack_fffffffffffff038;
  Mat *in_stack_fffffffffffff040;
  Mat *in_stack_fffffffffffff048;
  bool local_f21;
  void *local_f00;
  int local_ecc;
  void *local_ec8;
  int *local_ec0;
  ulong local_eb8;
  undefined4 local_eb0;
  long *local_ea8;
  int local_ea0;
  int local_e9c;
  int local_e98;
  undefined4 local_e94;
  undefined4 local_e90;
  ulong local_e88;
  void *local_e80;
  int *local_e78;
  ulong local_e70;
  undefined4 local_e68;
  long *local_e60;
  int local_e58;
  int local_e54;
  int local_e50;
  undefined4 local_e4c;
  undefined4 local_e48;
  ulong local_e40;
  void *local_e38;
  int *local_e30;
  long local_e28;
  undefined4 local_e20;
  long *local_e18;
  undefined4 in_stack_fffffffffffff1f0;
  undefined4 in_stack_fffffffffffff1f4;
  Option *in_stack_fffffffffffff1f8;
  undefined4 uVar9;
  undefined4 *local_de8;
  int *local_de0;
  size_t local_dd8;
  int local_dd0;
  Allocator *local_dc8;
  undefined4 local_dc0;
  int local_dbc;
  undefined4 local_db8;
  undefined4 local_db4;
  undefined4 local_db0;
  long local_da8;
  void *local_da0;
  int *local_d98;
  ulong local_d90;
  undefined4 local_d88;
  long *local_d80;
  int local_d78;
  int local_d74;
  int local_d70;
  undefined4 local_d6c;
  undefined4 local_d68;
  ulong local_d60;
  void *local_d58;
  int *local_d50;
  ulong local_d48;
  undefined4 local_d40;
  long *local_d38;
  int local_d30;
  int local_d2c;
  int local_d28;
  undefined4 local_d24;
  undefined4 local_d20;
  ulong local_d18;
  void *local_d10;
  int *local_d08;
  ulong local_d00;
  undefined4 local_cf8;
  long *local_cf0;
  int local_ce8;
  int local_ce4;
  int local_ce0;
  undefined4 local_cdc;
  undefined4 local_cd8;
  ulong local_cd0;
  int local_cc4;
  undefined4 *local_cc0;
  int *local_cb8;
  size_t local_cb0;
  int local_ca8;
  Allocator *local_ca0;
  undefined4 local_c98;
  int local_c94;
  undefined4 local_c90;
  undefined4 local_c8c;
  undefined4 local_c88;
  long local_c80;
  void *local_c78;
  int *local_c70;
  long local_c68;
  undefined4 local_c60;
  long *local_c58;
  undefined4 local_c50;
  int local_c4c;
  undefined4 local_c48;
  undefined4 local_c44;
  int local_c40;
  long local_c38;
  void *local_c30;
  int *local_c28;
  long local_c20;
  undefined4 local_c18;
  long *local_c10;
  undefined4 local_c08;
  int local_c04;
  undefined4 local_c00;
  undefined4 local_bfc;
  int local_bf8;
  long local_bf0;
  Mat local_be8;
  Mat local_ba0;
  void *local_b58;
  int *local_b50;
  ulong local_b48;
  undefined4 local_b40;
  long *local_b38;
  int local_b30;
  int local_b2c;
  int local_b28;
  undefined4 local_b24;
  undefined4 local_b20;
  ulong local_b18;
  int local_b0c;
  reference local_b08;
  int local_b00;
  Mat local_af0;
  void *local_aa8;
  value_type local_aa0;
  undefined4 local_a58;
  int local_a54;
  const_reference local_a50;
  long local_a48;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_a40;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_a38;
  int local_a24;
  value_type *local_a20;
  Mat *local_a18;
  Mat *local_a08;
  Mat *local_9f8;
  void **local_9e8;
  void **local_9d8;
  void **local_9c8;
  void **local_9b8;
  void **local_9a8;
  void **local_998;
  void **local_988;
  undefined4 **local_978;
  undefined4 **local_968;
  void **local_958;
  void **local_948;
  value_type *local_938;
  int local_928;
  undefined4 local_924;
  reference local_920;
  reference local_918;
  reference local_910;
  int local_908;
  undefined4 local_904;
  value_type *local_900;
  value_type *local_8f8;
  value_type *local_8f0;
  void **local_8e8;
  void **local_8e0;
  reference local_8d8;
  value_type *local_8d0;
  int local_8c4;
  undefined4 *local_8c0;
  int local_8b8;
  undefined4 local_8b4;
  value_type *local_8b0;
  undefined1 local_8a5;
  undefined4 local_8a4;
  long *local_8a0;
  void **local_898;
  undefined1 local_885;
  undefined4 local_884;
  long *local_880;
  void **local_878;
  undefined1 local_865;
  undefined4 local_864;
  long *local_860;
  void **local_858;
  undefined1 local_845;
  undefined4 local_844;
  undefined8 *local_840;
  void **local_838;
  undefined1 local_825;
  undefined4 local_824;
  undefined8 *local_820;
  void **local_818;
  undefined1 local_805;
  undefined4 local_804;
  undefined8 *local_800;
  void **local_7f8;
  undefined1 local_7e5;
  undefined4 local_7e4;
  undefined8 *local_7e0;
  Mat *local_7d8;
  undefined1 local_7c5;
  undefined4 local_7c4;
  undefined8 *local_7c0;
  Mat *local_7b8;
  undefined1 local_7a5;
  undefined4 local_7a4;
  undefined8 *local_7a0;
  void **local_798;
  undefined8 local_788;
  undefined8 local_780;
  int local_778;
  undefined4 local_774;
  void **local_770;
  undefined8 local_768;
  undefined8 local_760;
  int local_758;
  undefined4 local_754;
  void **local_750;
  int local_744;
  reference local_740;
  int local_734;
  void **local_730;
  int local_724;
  void **local_720;
  undefined4 local_718;
  undefined4 local_714;
  value_type *local_710;
  undefined4 **local_708;
  undefined4 local_700;
  undefined4 local_6fc;
  value_type *local_6f8;
  undefined4 **local_6f0;
  int local_658;
  undefined4 local_654;
  value_type *local_650;
  int local_648;
  undefined4 local_644;
  reference local_640;
  int local_628;
  undefined4 local_624;
  value_type *local_620;
  int local_608;
  undefined4 local_604;
  void **local_600;
  int local_5e8;
  undefined4 local_5e4;
  void **local_5e0;
  int local_5c8;
  undefined4 local_5c4;
  undefined4 **local_5c0;
  int local_5a8;
  undefined4 local_5a4;
  undefined4 **local_5a0;
  int local_588;
  undefined4 local_584;
  void **local_580;
  int local_568;
  undefined4 local_564;
  void **local_560;
  int local_548;
  undefined4 local_544;
  void **local_540;
  int local_528;
  undefined4 local_524;
  void **local_520;
  int local_508;
  undefined4 local_504;
  void **local_500;
  int local_4e8;
  undefined4 local_4e4;
  void **local_4e0;
  int local_4c8;
  undefined4 local_4c4;
  void **local_4c0;
  int local_4a8;
  undefined4 local_4a4;
  Mat *local_4a0;
  int local_488;
  undefined4 local_484;
  Mat *local_480;
  int local_468;
  undefined4 local_464;
  Mat *local_460;
  void *local_448;
  void *local_438;
  void *local_428;
  void *local_418;
  void *local_408;
  void *local_3f8;
  void *local_3e8;
  void *local_3d8;
  void *local_3c8;
  undefined4 *local_3b8;
  undefined4 *local_3a8;
  void *local_398;
  void *local_388;
  undefined4 *local_378;
  void *local_368;
  undefined4 *local_360;
  value_type *local_310;
  value_type *local_308;
  reference local_300;
  void **local_2f8;
  void **local_2f0;
  long *local_2e8;
  undefined4 local_2dc;
  ulong local_2d8;
  void *local_2d0;
  undefined4 local_2c4;
  int local_2c0;
  int local_2bc;
  void **local_2b8;
  Allocator *local_2b0;
  int local_2a4;
  ulong local_2a0;
  void *local_298;
  int local_28c;
  int local_288;
  int local_284;
  Mat *local_280;
  Allocator *local_278;
  int local_26c;
  ulong local_268;
  void *local_260;
  int local_254;
  int local_250;
  int local_24c;
  Mat *local_248;
  long *local_240;
  undefined4 local_234;
  ulong local_230;
  void *local_228;
  undefined4 local_21c;
  int local_218;
  int local_214;
  void **local_210;
  long *local_208;
  undefined4 local_1fc;
  ulong local_1f8;
  void *local_1f0;
  undefined4 local_1e4;
  int local_1e0;
  int local_1dc;
  void **local_1d8;
  long *local_1d0;
  undefined4 local_1c4;
  ulong local_1c0;
  void *local_1b8;
  undefined4 local_1ac;
  int local_1a8;
  int local_1a4;
  void **local_1a0;
  long *local_198;
  undefined4 local_18c;
  long local_188;
  void *local_180;
  undefined4 local_174;
  undefined4 local_170;
  int local_16c;
  void **local_168;
  long *local_160;
  undefined4 local_154;
  ulong local_150;
  void *local_148;
  undefined4 local_13c;
  int local_138;
  int local_134;
  void **local_130;
  long *local_128;
  undefined4 local_11c;
  ulong local_118;
  void *local_110;
  undefined4 local_104;
  int local_100;
  int local_fc;
  void **local_f8;
  undefined4 local_ec;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  Allocator *local_60;
  int local_54;
  size_t local_50;
  undefined4 *local_48;
  undefined4 local_40;
  int local_3c;
  undefined4 **local_38;
  Allocator *local_30;
  int local_24;
  size_t local_20;
  undefined4 *local_18;
  undefined4 local_10;
  int local_c;
  undefined4 **local_8;
  
  local_a48 = in_RCX;
  local_a40 = in_RDX;
  local_a38 = in_RSI;
  local_a50 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_a54 = local_a50->h;
  iVar2 = 2;
  local_a58 = 1;
  if (*(int *)(in_RDI + 0xd8) == 2) {
    local_a58 = 2;
  }
  local_a20 = &local_aa0;
  local_aa0.data = (undefined4 *)0x0;
  local_aa0.refcount = (int *)0x0;
  local_aa0.elemsize = 0;
  local_aa0.elempack = 0;
  local_aa0.allocator = (Allocator *)0x0;
  local_aa0.dims = 0;
  local_aa0.w = 0;
  local_aa0.h = 0;
  local_aa0.d = 0;
  local_aa0.c = 0;
  local_aa0.cstep = 0;
  sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a40);
  if (sVar4 == 2) {
    local_f00 = *(void **)(local_a48 + 8);
  }
  else {
    local_f00 = *(void **)(local_a48 + 0x10);
  }
  local_aa8 = local_f00;
  sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a38);
  if (sVar4 == 2) {
    __fn = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a38,1);
    Mat::clone(&local_af0,(__fn *)__fn,local_aa8,iVar2,in_R8);
    local_900 = &local_af0;
    local_8f8 = &local_aa0;
    if (&local_aa0 != local_900) {
      if (local_af0.refcount != (int *)0x0) {
        local_904 = 1;
        LOCK();
        local_908 = *local_af0.refcount;
        *local_af0.refcount = *local_af0.refcount + 1;
        UNLOCK();
      }
      local_650 = &local_aa0;
      if (local_aa0.refcount != (int *)0x0) {
        local_654 = 0xffffffff;
        LOCK();
        local_658 = *local_aa0.refcount;
        *local_aa0.refcount = *local_aa0.refcount + -1;
        UNLOCK();
        if (local_658 == 1) {
          if (local_aa0.allocator == (Allocator *)0x0) {
            local_360 = (undefined4 *)local_aa0.data;
            if ((undefined4 *)local_aa0.data != (undefined4 *)0x0) {
              free(local_aa0.data);
            }
          }
          else {
            (*(local_aa0.allocator)->_vptr_Allocator[3])(local_aa0.allocator,local_aa0.data);
          }
        }
      }
      local_aa0.data = (void *)0x0;
      local_aa0.elemsize = 0;
      local_aa0.elempack = 0;
      local_aa0.dims = 0;
      local_aa0.w = 0;
      local_aa0.h = 0;
      local_aa0.d = 0;
      local_aa0.c = 0;
      local_aa0.cstep = 0;
      local_aa0.refcount = (int *)0x0;
      local_aa0.data = local_900->data;
      local_aa0.refcount = local_900->refcount;
      local_aa0.elemsize = local_900->elemsize;
      local_aa0.elempack = local_900->elempack;
      local_aa0.allocator = local_900->allocator;
      local_aa0.dims = local_900->dims;
      local_aa0.w = local_900->w;
      local_aa0.h = local_900->h;
      local_aa0.d = local_900->d;
      local_aa0.c = local_900->c;
      local_aa0.cstep = local_900->cstep;
    }
    local_a18 = &local_af0;
    local_8f0 = &local_aa0;
    local_460 = local_a18;
    if (local_af0.refcount != (int *)0x0) {
      local_464 = 0xffffffff;
      LOCK();
      local_468 = *local_af0.refcount;
      *local_af0.refcount = *local_af0.refcount + -1;
      UNLOCK();
      if (local_468 == 1) {
        if (local_af0.allocator == (Allocator *)0x0) {
          if (local_af0.data != (void *)0x0) {
            free(local_af0.data);
          }
        }
        else {
          (*(local_af0.allocator)->_vptr_Allocator[3])(local_af0.allocator,local_af0.data);
        }
      }
    }
    local_af0.data = (void *)0x0;
    local_af0.elemsize = 0;
    local_af0.elempack = 0;
    local_af0.dims = 0;
    local_af0.w = 0;
    local_af0.h = 0;
    local_af0.d = 0;
    local_af0.c = 0;
    local_af0.cstep = 0;
    local_af0.refcount = (int *)0x0;
  }
  else {
    Mat::create(in_stack_ffffffffffffee60,(int)((ulong)in_stack_ffffffffffffee58 >> 0x20),
                (int)in_stack_ffffffffffffee58,in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
    local_8d0 = &local_aa0;
    if ((undefined4 *)local_aa0.data != (undefined4 *)0x0) {
      local_308 = local_8d0;
    }
    local_f21 = (undefined4 *)local_aa0.data == (undefined4 *)0x0 ||
                local_aa0.cstep * (long)local_aa0.c == 0;
    if (local_f21) {
      local_a24 = -100;
      local_b00 = 1;
      goto LAB_01a1e1ef;
    }
    local_8b0 = &local_aa0;
    local_8b4 = 0;
    local_8b8 = (int)local_aa0.cstep * local_aa0.c;
    local_8c0 = (undefined4 *)local_aa0.data;
    for (local_8c4 = 0; local_310 = local_8b0, local_8c4 < local_8b8; local_8c4 = local_8c4 + 1) {
      *local_8c0 = 0;
      local_8c0 = local_8c0 + 1;
    }
  }
  local_b08 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a40,0);
  Mat::create(in_stack_ffffffffffffee60,(int)((ulong)in_stack_ffffffffffffee58 >> 0x20),
              (int)in_stack_ffffffffffffee58,in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  local_8d8 = local_b08;
  bVar6 = true;
  if (local_b08->data != (void *)0x0) {
    local_300 = local_b08;
    bVar6 = local_b08->cstep * (long)local_b08->c == 0;
  }
  if (bVar6) {
    local_a24 = -100;
    local_b00 = 1;
  }
  else {
    if ((*(int *)(in_RDI + 0xd8) == 0) || (*(int *)(in_RDI + 0xd8) == 1)) {
      local_7a0 = (undefined8 *)(in_RDI + 0x128);
      local_798 = &local_b58;
      local_2bc = *(int *)(in_RDI + 0x154);
      local_2c0 = *(int *)(in_RDI + 0x158);
      local_2c4 = *(undefined4 *)(in_RDI + 0x15c);
      local_2d0 = (void *)*local_7a0;
      local_2d8 = *(ulong *)(in_RDI + 0x138);
      local_2dc = *(undefined4 *)(in_RDI + 0x140);
      local_2e8 = *(long **)(in_RDI + 0x148);
      local_2b8 = &local_b58;
      local_b50 = (int *)0x0;
      local_b24 = 1;
      local_68 = (long)local_2bc * (long)local_2c0 * local_2d8;
      local_b18 = (local_68 + 0xfU & 0xfffffffffffffff0) / local_2d8;
      local_b30 = *(int *)(in_RDI + 0x150) + -1;
      if (*(int *)(in_RDI + 0x150) == 4) {
        local_b18 = (long)*(int *)(in_RDI + 0x154) * (long)*(int *)(in_RDI + 0x158);
      }
      local_7c0 = (undefined8 *)(in_RDI + 0x170);
      local_7b8 = &local_ba0;
      local_284 = *(int *)(in_RDI + 0x19c);
      local_288 = *(int *)(in_RDI + 0x1a0);
      local_28c = *(int *)(in_RDI + 0x1a4);
      local_298 = (void *)*local_7c0;
      local_2a0 = *(ulong *)(in_RDI + 0x180);
      local_2a4 = *(int *)(in_RDI + 0x188);
      local_2b0 = *(Allocator **)(in_RDI + 400);
      local_280 = &local_ba0;
      local_ba0.refcount = (int *)0x0;
      local_ba0.d = 1;
      local_78 = (long)local_284 * (long)local_288 * local_2a0;
      local_ba0.cstep = (local_78 + 0xfU & 0xfffffffffffffff0) / local_2a0;
      local_ba0.dims = *(int *)(in_RDI + 0x198) + -1;
      if (*(int *)(in_RDI + 0x198) == 4) {
        local_ba0.cstep = (long)*(int *)(in_RDI + 0x19c) * (long)*(int *)(in_RDI + 0x1a0);
      }
      local_7e0 = (undefined8 *)(in_RDI + 0xe0);
      local_7d8 = &local_be8;
      local_24c = *(int *)(in_RDI + 0x10c);
      local_250 = *(int *)(in_RDI + 0x110);
      local_254 = *(int *)(in_RDI + 0x114);
      local_260 = (void *)*local_7e0;
      local_268 = *(ulong *)(in_RDI + 0xf0);
      local_26c = *(int *)(in_RDI + 0xf8);
      local_278 = *(Allocator **)(in_RDI + 0x100);
      local_248 = &local_be8;
      local_be8.refcount = (int *)0x0;
      local_be8.d = 1;
      local_88 = (long)local_24c * (long)local_250 * local_268;
      local_be8.cstep = (local_88 + 0xfU & 0xfffffffffffffff0) / local_268;
      local_be8.dims = *(int *)(in_RDI + 0x108) + -1;
      if (*(int *)(in_RDI + 0x108) == 4) {
        local_be8.cstep = (long)*(int *)(in_RDI + 0x10c) * (long)*(int *)(in_RDI + 0x110);
      }
      local_6c = 0x10;
      local_7c = 0x10;
      local_8c = 0x10;
      local_7a4 = 0;
      local_7a5 = 1;
      local_7c4 = 0;
      local_7c5 = 1;
      local_7e4 = 0;
      local_7e5 = 1;
      local_be8.data = local_260;
      local_be8.elemsize = local_268;
      local_be8.elempack = local_26c;
      local_be8.allocator = local_278;
      local_be8.w = local_24c;
      local_be8.h = local_250;
      local_be8.c = local_254;
      local_ba0.data = local_298;
      local_ba0.elemsize = local_2a0;
      local_ba0.elempack = local_2a4;
      local_ba0.allocator = local_2b0;
      local_ba0.w = local_284;
      local_ba0.h = local_288;
      local_ba0.c = local_28c;
      local_b58 = local_2d0;
      local_b48 = local_2d8;
      local_b40 = local_2dc;
      local_b38 = local_2e8;
      local_b2c = local_2bc;
      local_b28 = local_2c0;
      local_b20 = local_2c4;
      iVar2 = gru(in_stack_fffffffffffff048,in_stack_fffffffffffff040,
                  (int)((ulong)in_stack_fffffffffffff038 >> 0x20),in_stack_fffffffffffff030,
                  in_stack_fffffffffffff028,in_stack_fffffffffffff020,
                  (Mat *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
                  in_stack_fffffffffffff1f8);
      in_stack_fffffffffffff048 = &local_be8;
      local_a08 = in_stack_fffffffffffff048;
      local_480 = in_stack_fffffffffffff048;
      if (local_be8.refcount != (int *)0x0) {
        local_484 = 0xffffffff;
        LOCK();
        local_488 = *local_be8.refcount;
        *local_be8.refcount = *local_be8.refcount + -1;
        UNLOCK();
        if (local_488 == 1) {
          if (local_be8.allocator == (Allocator *)0x0) {
            local_448 = local_be8.data;
            if (local_be8.data != (void *)0x0) {
              free(local_be8.data);
            }
          }
          else {
            (*(local_be8.allocator)->_vptr_Allocator[3])(local_be8.allocator,local_be8.data);
          }
        }
      }
      in_stack_fffffffffffff048->data = (void *)0x0;
      in_stack_fffffffffffff048->elemsize = 0;
      in_stack_fffffffffffff048->elempack = 0;
      in_stack_fffffffffffff048->dims = 0;
      in_stack_fffffffffffff048->w = 0;
      in_stack_fffffffffffff048->h = 0;
      in_stack_fffffffffffff048->d = 0;
      in_stack_fffffffffffff048->c = 0;
      in_stack_fffffffffffff048->cstep = 0;
      in_stack_fffffffffffff048->refcount = (int *)0x0;
      in_stack_fffffffffffff040 = &local_ba0;
      local_9f8 = in_stack_fffffffffffff040;
      local_4a0 = in_stack_fffffffffffff040;
      if (local_ba0.refcount != (int *)0x0) {
        local_4a4 = 0xffffffff;
        LOCK();
        local_4a8 = *local_ba0.refcount;
        *local_ba0.refcount = *local_ba0.refcount + -1;
        UNLOCK();
        if (local_4a8 == 1) {
          if (local_ba0.allocator == (Allocator *)0x0) {
            local_438 = local_ba0.data;
            if (local_ba0.data != (void *)0x0) {
              free(local_ba0.data);
            }
          }
          else {
            (*(local_ba0.allocator)->_vptr_Allocator[3])(local_ba0.allocator,local_ba0.data);
          }
        }
      }
      in_stack_fffffffffffff040->data = (void *)0x0;
      in_stack_fffffffffffff040->elemsize = 0;
      in_stack_fffffffffffff040->elempack = 0;
      in_stack_fffffffffffff040->dims = 0;
      in_stack_fffffffffffff040->w = 0;
      in_stack_fffffffffffff040->h = 0;
      in_stack_fffffffffffff040->d = 0;
      in_stack_fffffffffffff040->c = 0;
      in_stack_fffffffffffff040->cstep = 0;
      in_stack_fffffffffffff040->refcount = (int *)0x0;
      in_stack_fffffffffffff038 = &local_b58;
      local_9e8 = in_stack_fffffffffffff038;
      local_4c0 = in_stack_fffffffffffff038;
      if (local_b50 != (int *)0x0) {
        local_4c4 = 0xffffffff;
        LOCK();
        local_4c8 = *local_b50;
        *local_b50 = *local_b50 + -1;
        UNLOCK();
        if (local_4c8 == 1) {
          if (local_b38 == (long *)0x0) {
            local_428 = local_b58;
            if (local_b58 != (void *)0x0) {
              free(local_b58);
            }
          }
          else {
            (**(code **)(*local_b38 + 0x18))(local_b38,local_b58);
          }
        }
      }
      *in_stack_fffffffffffff038 = (void *)0x0;
      in_stack_fffffffffffff038[2] = (void *)0x0;
      *(undefined4 *)(in_stack_fffffffffffff038 + 3) = 0;
      *(undefined4 *)(in_stack_fffffffffffff038 + 5) = 0;
      *(undefined4 *)((long)in_stack_fffffffffffff038 + 0x2c) = 0;
      *(undefined4 *)(in_stack_fffffffffffff038 + 6) = 0;
      *(undefined4 *)((long)in_stack_fffffffffffff038 + 0x34) = 0;
      *(undefined4 *)(in_stack_fffffffffffff038 + 7) = 0;
      in_stack_fffffffffffff038[8] = (void *)0x0;
      in_stack_fffffffffffff038[1] = (void *)0x0;
      local_b0c = iVar2;
      if (iVar2 != 0) {
        local_b00 = 1;
        local_a24 = iVar2;
        goto LAB_01a1e1ef;
      }
    }
    iVar2 = (int)((ulong)in_stack_fffffffffffff038 >> 0x20);
    if (*(int *)(in_RDI + 0xd8) == 2) {
      local_774 = *(undefined4 *)(in_RDI + 0xd0);
      local_788 = *(undefined8 *)(local_a48 + 0x10);
      local_770 = &local_c30;
      local_778 = local_a54;
      local_780 = 4;
      local_c30 = (void *)0x0;
      local_c28 = (int *)0x0;
      local_c20 = 0;
      local_c18 = 0;
      local_c10 = (long *)0x0;
      local_c08 = 0;
      local_c04 = 0;
      local_c00 = 0;
      local_bfc = 0;
      local_bf8 = 0;
      local_bf0 = 0;
      Mat::create(in_stack_ffffffffffffee60,(int)((ulong)in_stack_ffffffffffffee58 >> 0x20),
                  (int)in_stack_ffffffffffffee58,in_stack_ffffffffffffee50,in_stack_ffffffffffffee48
                 );
      local_8e0 = &local_c30;
      if (local_c30 != (void *)0x0) {
        local_2f8 = local_8e0;
      }
      local_fe9 = local_c30 != (void *)0x0 && local_bf0 * local_bf8 != 0;
      if (local_fe9) {
        local_754 = *(undefined4 *)(in_RDI + 0xd0);
        local_768 = *(undefined8 *)(local_a48 + 0x10);
        local_750 = &local_c78;
        local_758 = local_a54;
        local_760 = 4;
        local_c78 = (void *)0x0;
        local_c70 = (int *)0x0;
        local_c68 = 0;
        local_c60 = 0;
        local_c58 = (long *)0x0;
        local_c50 = 0;
        local_c4c = 0;
        local_c48 = 0;
        local_c44 = 0;
        local_c40 = 0;
        local_c38 = 0;
        Mat::create(in_stack_ffffffffffffee60,(int)((ulong)in_stack_ffffffffffffee58 >> 0x20),
                    (int)in_stack_ffffffffffffee58,in_stack_ffffffffffffee50,
                    in_stack_ffffffffffffee48);
        local_8e8 = &local_c78;
        if (local_c78 != (void *)0x0) {
          local_2f0 = local_8e8;
        }
        local_1009 = local_c78 != (void *)0x0 && local_c38 * local_c40 != 0;
        if (local_1009) {
          local_6f0 = &local_cc0;
          local_6f8 = &local_aa0;
          local_38 = &local_cc0;
          local_cc0 = (undefined4 *)local_aa0.data;
          local_cb8 = (int *)0x0;
          local_cb0 = local_aa0.elemsize;
          local_ca8 = local_aa0.elempack;
          local_ca0 = local_aa0.allocator;
          local_c98 = 2;
          local_c94 = local_aa0.w;
          local_c90 = 1;
          local_c8c = 1;
          local_c88 = 1;
          local_c80 = (long)local_aa0.w;
          local_800 = (undefined8 *)(in_RDI + 0x128);
          local_7f8 = &local_d10;
          local_214 = *(int *)(in_RDI + 0x154);
          local_218 = *(int *)(in_RDI + 0x158);
          local_21c = *(undefined4 *)(in_RDI + 0x15c);
          local_228 = (void *)*local_800;
          local_230 = *(ulong *)(in_RDI + 0x138);
          local_234 = *(undefined4 *)(in_RDI + 0x140);
          local_240 = *(long **)(in_RDI + 0x148);
          local_210 = &local_d10;
          local_d08 = (int *)0x0;
          local_cdc = 1;
          local_98 = (long)local_214 * (long)local_218 * local_230;
          local_cd0 = (local_98 + 0xfU & 0xfffffffffffffff0) / local_230;
          local_ce8 = *(int *)(in_RDI + 0x150) + -1;
          if (*(int *)(in_RDI + 0x150) == 4) {
            local_cd0 = (long)*(int *)(in_RDI + 0x154) * (long)*(int *)(in_RDI + 0x158);
          }
          local_820 = (undefined8 *)(in_RDI + 0x170);
          local_818 = &local_d58;
          local_1dc = *(int *)(in_RDI + 0x19c);
          local_1e0 = *(int *)(in_RDI + 0x1a0);
          local_1e4 = *(undefined4 *)(in_RDI + 0x1a4);
          local_1f0 = (void *)*local_820;
          local_1f8 = *(ulong *)(in_RDI + 0x180);
          local_1fc = *(undefined4 *)(in_RDI + 0x188);
          local_208 = *(long **)(in_RDI + 400);
          local_1d8 = &local_d58;
          local_d50 = (int *)0x0;
          local_d24 = 1;
          local_a8 = (long)local_1dc * (long)local_1e0 * local_1f8;
          local_d18 = (local_a8 + 0xfU & 0xfffffffffffffff0) / local_1f8;
          local_d30 = *(int *)(in_RDI + 0x198) + -1;
          if (*(int *)(in_RDI + 0x198) == 4) {
            local_d18 = (long)*(int *)(in_RDI + 0x19c) * (long)*(int *)(in_RDI + 0x1a0);
          }
          local_840 = (undefined8 *)(in_RDI + 0xe0);
          local_838 = &local_da0;
          local_1a4 = *(int *)(in_RDI + 0x10c);
          local_1a8 = *(int *)(in_RDI + 0x110);
          local_1ac = *(undefined4 *)(in_RDI + 0x114);
          local_1b8 = (void *)*local_840;
          local_1c0 = *(ulong *)(in_RDI + 0xf0);
          local_1c4 = *(undefined4 *)(in_RDI + 0xf8);
          local_1d0 = *(long **)(in_RDI + 0x100);
          local_1a0 = &local_da0;
          local_d98 = (int *)0x0;
          local_d6c = 1;
          local_b8 = (long)local_1a4 * (long)local_1a8 * local_1c0;
          local_d60 = (local_b8 + 0xfU & 0xfffffffffffffff0) / local_1c0;
          local_d78 = *(int *)(in_RDI + 0x108) + -1;
          if (*(int *)(in_RDI + 0x108) == 4) {
            local_d60 = (long)*(int *)(in_RDI + 0x10c) * (long)*(int *)(in_RDI + 0x110);
          }
          local_3c = local_aa0.w;
          local_40 = 1;
          local_48 = (undefined4 *)local_aa0.data;
          local_50 = local_aa0.elemsize;
          local_54 = local_aa0.elempack;
          local_60 = local_aa0.allocator;
          local_9c = 0x10;
          local_ac = 0x10;
          local_bc = 0x10;
          local_6fc = 0;
          local_700 = 1;
          local_804 = 0;
          local_805 = 1;
          local_824 = 0;
          local_825 = 1;
          local_844 = 0;
          local_845 = 1;
          local_da0 = local_1b8;
          local_d90 = local_1c0;
          local_d88 = local_1c4;
          local_d80 = local_1d0;
          local_d74 = local_1a4;
          local_d70 = local_1a8;
          local_d68 = local_1ac;
          local_d58 = local_1f0;
          local_d48 = local_1f8;
          local_d40 = local_1fc;
          local_d38 = local_208;
          local_d2c = local_1dc;
          local_d28 = local_1e0;
          local_d20 = local_1e4;
          local_d10 = local_228;
          local_d00 = local_230;
          local_cf8 = local_234;
          local_cf0 = local_240;
          local_ce4 = local_214;
          local_ce0 = local_218;
          local_cd8 = local_21c;
          iVar3 = gru(in_stack_fffffffffffff048,in_stack_fffffffffffff040,iVar2,
                      in_stack_fffffffffffff030,in_stack_fffffffffffff028,in_stack_fffffffffffff020,
                      (Mat *)CONCAT44(in_stack_fffffffffffff1f4,in_stack_fffffffffffff1f0),
                      in_stack_fffffffffffff1f8);
          local_9d8 = &local_da0;
          local_4e0 = local_9d8;
          if (local_d98 != (int *)0x0) {
            local_4e4 = 0xffffffff;
            LOCK();
            local_4e8 = *local_d98;
            *local_d98 = *local_d98 + -1;
            UNLOCK();
            if (local_4e8 == 1) {
              if (local_d80 == (long *)0x0) {
                local_418 = local_da0;
                if (local_da0 != (void *)0x0) {
                  free(local_da0);
                }
              }
              else {
                (**(code **)(*local_d80 + 0x18))(local_d80,local_da0);
              }
            }
          }
          local_da0 = (void *)0x0;
          local_d90 = 0;
          local_d88 = 0;
          local_d78 = 0;
          local_d74 = 0;
          local_d70 = 0;
          local_d6c = 0;
          local_d68 = 0;
          local_d60 = 0;
          local_d98 = (int *)0x0;
          local_9c8 = &local_d58;
          local_500 = local_9c8;
          if (local_d50 != (int *)0x0) {
            local_504 = 0xffffffff;
            LOCK();
            local_508 = *local_d50;
            *local_d50 = *local_d50 + -1;
            UNLOCK();
            if (local_508 == 1) {
              if (local_d38 == (long *)0x0) {
                local_408 = local_d58;
                if (local_d58 != (void *)0x0) {
                  free(local_d58);
                }
              }
              else {
                (**(code **)(*local_d38 + 0x18))(local_d38,local_d58);
              }
            }
          }
          local_d58 = (void *)0x0;
          local_d48 = 0;
          local_d40 = 0;
          local_d30 = 0;
          local_d2c = 0;
          local_d28 = 0;
          local_d24 = 0;
          local_d20 = 0;
          local_d18 = 0;
          local_d50 = (int *)0x0;
          local_9b8 = &local_d10;
          local_520 = local_9b8;
          if (local_d08 != (int *)0x0) {
            local_524 = 0xffffffff;
            LOCK();
            local_528 = *local_d08;
            *local_d08 = *local_d08 + -1;
            UNLOCK();
            if (local_528 == 1) {
              if (local_cf0 == (long *)0x0) {
                local_3f8 = local_d10;
                if (local_d10 != (void *)0x0) {
                  free(local_d10);
                }
              }
              else {
                (**(code **)(*local_cf0 + 0x18))(local_cf0,local_d10);
              }
            }
          }
          local_d10 = (void *)0x0;
          local_d00 = 0;
          local_cf8 = 0;
          local_ce8 = 0;
          local_ce4 = 0;
          local_ce0 = 0;
          local_cdc = 0;
          local_cd8 = 0;
          local_cd0 = 0;
          local_d08 = (int *)0x0;
          local_cc4 = iVar3;
          if (iVar3 == 0) {
            local_708 = &local_de8;
            local_710 = &local_aa0;
            local_18 = (undefined4 *)((long)local_aa0.data + (long)local_aa0.w * local_aa0.elemsize)
            ;
            local_8 = &local_de8;
            local_de0 = (int *)0x0;
            local_dd8 = local_aa0.elemsize;
            local_dd0 = local_aa0.elempack;
            local_dc8 = local_aa0.allocator;
            local_dc0 = 2;
            local_dbc = local_aa0.w;
            local_db8 = 1;
            local_db4 = 1;
            local_db0 = 1;
            local_da8 = (long)local_aa0.w;
            local_860 = (long *)(in_RDI + 0x128);
            local_858 = &local_e38;
            local_16c = *(int *)(in_RDI + 0x154);
            local_170 = *(undefined4 *)(in_RDI + 0x158);
            local_174 = *(undefined4 *)(in_RDI + 0x15c);
            local_180 = (void *)(*local_860 + *(long *)(in_RDI + 0x168) * *(long *)(in_RDI + 0x138))
            ;
            local_188 = *(long *)(in_RDI + 0x138);
            local_18c = *(undefined4 *)(in_RDI + 0x140);
            local_198 = *(long **)(in_RDI + 0x148);
            local_168 = &local_e38;
            local_e30 = (int *)0x0;
            uVar9 = 1;
            local_c8 = (long)local_16c * (long)(int)in_stack_fffffffffffff1f8 * local_188;
            local_880 = (long *)(in_RDI + 0x170);
            local_878 = &local_e80;
            local_134 = *(int *)(in_RDI + 0x19c);
            local_138 = *(int *)(in_RDI + 0x1a0);
            local_13c = *(undefined4 *)(in_RDI + 0x1a4);
            local_148 = (void *)(*local_880 + *(long *)(in_RDI + 0x1b0) * *(long *)(in_RDI + 0x180))
            ;
            local_150 = *(ulong *)(in_RDI + 0x180);
            local_154 = *(undefined4 *)(in_RDI + 0x188);
            local_160 = *(long **)(in_RDI + 400);
            local_130 = &local_e80;
            local_e78 = (int *)0x0;
            local_e4c = 1;
            local_d8 = (long)local_134 * (long)local_138 * local_150;
            local_e40 = (local_d8 + 0xfU & 0xfffffffffffffff0) / local_150;
            local_e58 = *(int *)(in_RDI + 0x198) + -1;
            if (*(int *)(in_RDI + 0x198) == 4) {
              local_e40 = (long)*(int *)(in_RDI + 0x19c) * (long)*(int *)(in_RDI + 0x1a0);
            }
            local_8a0 = (long *)(in_RDI + 0xe0);
            local_898 = &local_ec8;
            local_fc = *(int *)(in_RDI + 0x10c);
            local_100 = *(int *)(in_RDI + 0x110);
            local_104 = *(undefined4 *)(in_RDI + 0x114);
            local_110 = (void *)(*local_8a0 + *(long *)(in_RDI + 0x120) * *(long *)(in_RDI + 0xf0));
            local_118 = *(ulong *)(in_RDI + 0xf0);
            local_11c = *(undefined4 *)(in_RDI + 0xf8);
            local_128 = *(long **)(in_RDI + 0x100);
            local_f8 = &local_ec8;
            local_ec0 = (int *)0x0;
            local_e94 = 1;
            local_e8 = (long)local_fc * (long)local_100 * local_118;
            local_e88 = (local_e8 + 0xfU & 0xfffffffffffffff0) / local_118;
            local_ea0 = *(int *)(in_RDI + 0x108) + -1;
            if (*(int *)(in_RDI + 0x108) == 4) {
              local_e88 = (long)*(int *)(in_RDI + 0x10c) * (long)*(int *)(in_RDI + 0x110);
            }
            local_c = local_aa0.w;
            local_10 = 1;
            local_20 = local_aa0.elemsize;
            local_24 = local_aa0.elempack;
            local_30 = local_aa0.allocator;
            local_cc = 0x10;
            local_dc = 0x10;
            local_ec = 0x10;
            local_714 = 1;
            local_718 = 1;
            local_864 = 1;
            local_865 = 1;
            local_884 = 1;
            local_885 = 1;
            local_8a4 = 1;
            local_8a5 = 1;
            local_cd0 = 0;
            local_ce8 = 0;
            local_ec8 = local_110;
            local_eb8 = local_118;
            local_eb0 = local_11c;
            local_ea8 = local_128;
            local_e9c = local_fc;
            local_e98 = local_100;
            local_e90 = local_104;
            local_e80 = local_148;
            local_e70 = local_150;
            local_e68 = local_154;
            local_e60 = local_160;
            local_e54 = local_134;
            local_e50 = local_138;
            local_e48 = local_13c;
            local_e38 = local_180;
            local_e28 = local_188;
            local_e20 = local_18c;
            local_e18 = local_198;
            local_de8 = local_18;
            iVar2 = gru(in_stack_fffffffffffff048,in_stack_fffffffffffff040,iVar2,
                        in_stack_fffffffffffff030,in_stack_fffffffffffff028,
                        in_stack_fffffffffffff020,
                        (Mat *)CONCAT44(local_16c,*(int *)(in_RDI + 0x150) + -1),
                        in_stack_fffffffffffff1f8);
            local_9a8 = &local_ec8;
            local_540 = local_9a8;
            if (local_ec0 != (int *)0x0) {
              local_544 = 0xffffffff;
              LOCK();
              local_548 = *local_ec0;
              *local_ec0 = *local_ec0 + -1;
              UNLOCK();
              if (local_548 == 1) {
                if (local_ea8 == (long *)0x0) {
                  local_3e8 = local_ec8;
                  if (local_ec8 != (void *)0x0) {
                    free(local_ec8);
                  }
                }
                else {
                  (**(code **)(*local_ea8 + 0x18))(local_ea8,local_ec8);
                }
              }
            }
            local_ec8 = (void *)0x0;
            local_eb8 = 0;
            local_eb0 = 0;
            local_ea0 = 0;
            local_e9c = 0;
            local_e98 = 0;
            local_e94 = 0;
            local_e90 = 0;
            local_e88 = 0;
            local_ec0 = (int *)0x0;
            local_998 = &local_e80;
            local_560 = local_998;
            if (local_e78 != (int *)0x0) {
              local_564 = 0xffffffff;
              LOCK();
              local_568 = *local_e78;
              *local_e78 = *local_e78 + -1;
              UNLOCK();
              if (local_568 == 1) {
                if (local_e60 == (long *)0x0) {
                  local_3d8 = local_e80;
                  if (local_e80 != (void *)0x0) {
                    free(local_e80);
                  }
                }
                else {
                  (**(code **)(*local_e60 + 0x18))(local_e60,local_e80);
                }
              }
            }
            local_e80 = (void *)0x0;
            local_e70 = 0;
            local_e68 = 0;
            local_e58 = 0;
            local_e54 = 0;
            local_e50 = 0;
            local_e4c = 0;
            local_e48 = 0;
            local_e40 = 0;
            local_e78 = (int *)0x0;
            local_988 = &local_e38;
            local_580 = local_988;
            if (local_e30 != (int *)0x0) {
              local_584 = 0xffffffff;
              LOCK();
              local_588 = *local_e30;
              *local_e30 = *local_e30 + -1;
              UNLOCK();
              if (local_588 == 1) {
                if (local_e18 == (long *)0x0) {
                  local_3c8 = local_e38;
                  if (local_e38 != (void *)0x0) {
                    free(local_e38);
                  }
                }
                else {
                  (**(code **)(*local_e18 + 0x18))(local_e18,local_e38);
                }
              }
            }
            local_e38 = (void *)0x0;
            local_e28 = 0;
            local_e20 = 0;
            local_e30 = (int *)0x0;
            if (iVar2 == 0) {
              for (local_ecc = 0; local_ecc < local_a54; local_ecc = local_ecc + 1) {
                local_720 = &local_c30;
                local_724 = local_ecc;
                local_730 = &local_c78;
                local_734 = local_ecc;
                __src = (void *)((long)local_c78 + (long)local_c4c * (long)local_ecc * local_c68);
                local_740 = local_b08;
                local_744 = local_ecc;
                __dest = (void *)((long)local_b08->data +
                                 (long)local_b08->w * (long)local_ecc * local_b08->elemsize);
                memcpy(__dest,(void *)((long)local_c30 +
                                      (long)local_c04 * (long)local_ecc * local_c20),
                       (long)*(int *)(in_RDI + 0xd0) << 2);
                memcpy((void *)((long)__dest + (long)*(int *)(in_RDI + 0xd0) * 4),__src,
                       (long)*(int *)(in_RDI + 0xd0) << 2);
              }
              local_b00 = 0;
            }
            else {
              local_b00 = 1;
              local_a24 = iVar2;
            }
            local_978 = &local_de8;
            local_5a0 = local_978;
            if (local_de0 != (int *)0x0) {
              local_5a4 = 0xffffffff;
              LOCK();
              local_5a8 = *local_de0;
              *local_de0 = *local_de0 + -1;
              UNLOCK();
              if (local_5a8 == 1) {
                if (local_dc8 == (Allocator *)0x0) {
                  local_3b8 = local_de8;
                  if (local_de8 != (undefined4 *)0x0) {
                    free(local_de8);
                  }
                }
                else {
                  (*local_dc8->_vptr_Allocator[3])(local_dc8,local_de8);
                }
              }
            }
            local_de8 = (undefined4 *)0x0;
            local_dd8 = 0;
            local_dd0 = 0;
            local_dc0 = 0;
            local_dbc = 0;
            local_db8 = 0;
            local_db4 = 0;
            local_db0 = 0;
            local_da8 = 0;
            local_de0 = (int *)0x0;
          }
          else {
            local_b00 = 1;
            local_a24 = iVar3;
          }
          local_968 = &local_cc0;
          local_5c0 = local_968;
          if (local_cb8 != (int *)0x0) {
            local_5c4 = 0xffffffff;
            LOCK();
            local_5c8 = *local_cb8;
            *local_cb8 = *local_cb8 + -1;
            UNLOCK();
            if (local_5c8 == 1) {
              if (local_ca0 == (Allocator *)0x0) {
                local_3a8 = local_cc0;
                if (local_cc0 != (undefined4 *)0x0) {
                  free(local_cc0);
                }
              }
              else {
                (*local_ca0->_vptr_Allocator[3])(local_ca0,local_cc0);
              }
            }
          }
          local_cc0 = (undefined4 *)0x0;
          local_cb0 = 0;
          local_ca8 = 0;
          local_c98 = 0;
          local_c94 = 0;
          local_c90 = 0;
          local_c8c = 0;
          local_c88 = 0;
          local_c80 = 0;
          local_cb8 = (int *)0x0;
        }
        else {
          local_a24 = -100;
          local_b00 = 1;
        }
        local_958 = &local_c78;
        local_5e0 = local_958;
        if (local_c70 != (int *)0x0) {
          local_5e4 = 0xffffffff;
          LOCK();
          local_5e8 = *local_c70;
          *local_c70 = *local_c70 + -1;
          UNLOCK();
          if (local_5e8 == 1) {
            if (local_c58 == (long *)0x0) {
              local_398 = local_c78;
              if (local_c78 != (void *)0x0) {
                free(local_c78);
              }
            }
            else {
              (**(code **)(*local_c58 + 0x18))(local_c58,local_c78);
            }
          }
        }
        local_c78 = (void *)0x0;
        local_c68 = 0;
        local_c60 = 0;
        local_c50 = 0;
        local_c4c = 0;
        local_c48 = 0;
        local_c44 = 0;
        local_c40 = 0;
        local_c38 = 0;
        local_c70 = (int *)0x0;
      }
      else {
        local_a24 = -100;
        local_b00 = 1;
      }
      local_948 = &local_c30;
      local_600 = local_948;
      if (local_c28 != (int *)0x0) {
        local_604 = 0xffffffff;
        LOCK();
        local_608 = *local_c28;
        *local_c28 = *local_c28 + -1;
        UNLOCK();
        if (local_608 == 1) {
          if (local_c10 == (long *)0x0) {
            local_388 = local_c30;
            if (local_c30 != (void *)0x0) {
              free(local_c30);
            }
          }
          else {
            (**(code **)(*local_c10 + 0x18))(local_c10,local_c30);
          }
        }
      }
      local_c30 = (void *)0x0;
      local_c20 = 0;
      local_c18 = 0;
      local_c08 = 0;
      local_c04 = 0;
      local_c00 = 0;
      local_bfc = 0;
      local_bf8 = 0;
      local_bf0 = 0;
      local_c28 = (int *)0x0;
      if (local_b00 != 0) goto LAB_01a1e1ef;
    }
    sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_a40);
    if (sVar4 == 2) {
      pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_a40,1);
      local_920 = &local_aa0;
      local_918 = pvVar5;
      local_910 = pvVar5;
      if (pvVar5 != local_920) {
        if (local_aa0.refcount != (int *)0x0) {
          local_924 = 1;
          LOCK();
          local_928 = *local_aa0.refcount;
          *local_aa0.refcount = *local_aa0.refcount + 1;
          UNLOCK();
        }
        pvVar8 = pvVar5;
        local_640 = pvVar5;
        if (pvVar5->refcount != (int *)0x0) {
          piVar1 = pvVar5->refcount;
          local_644 = 0xffffffff;
          LOCK();
          local_648 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_648 == 1) {
            if (pvVar5->allocator == (Allocator *)0x0) {
              local_368 = pvVar5->data;
              if (local_368 != (void *)0x0) {
                free(local_368);
              }
            }
            else {
              (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
            }
          }
        }
        pvVar5->data = (void *)0x0;
        pvVar5->elemsize = 0;
        pvVar5->elempack = 0;
        pvVar5->dims = 0;
        pvVar5->w = 0;
        pvVar5->h = 0;
        pvVar5->d = 0;
        pvVar5->c = 0;
        pvVar5->cstep = 0;
        pvVar5->refcount = (int *)0x0;
        pvVar8->data = local_920->data;
        pvVar8->refcount = local_920->refcount;
        pvVar8->elemsize = local_920->elemsize;
        pvVar8->elempack = local_920->elempack;
        pvVar8->allocator = local_920->allocator;
        pvVar8->dims = local_920->dims;
        pvVar8->w = local_920->w;
        pvVar8->h = local_920->h;
        pvVar8->d = local_920->d;
        pvVar8->c = local_920->c;
        pvVar8->cstep = local_920->cstep;
        local_910 = pvVar8;
      }
    }
    local_a24 = 0;
    local_b00 = 1;
  }
LAB_01a1e1ef:
  pvVar7 = &local_aa0;
  if (local_aa0.refcount != (int *)0x0) {
    local_624 = 0xffffffff;
    LOCK();
    local_628 = *local_aa0.refcount;
    *local_aa0.refcount = *local_aa0.refcount + -1;
    UNLOCK();
    if (local_628 == 1) {
      local_938 = pvVar7;
      local_620 = pvVar7;
      if (local_aa0.allocator == (Allocator *)0x0) {
        local_378 = (undefined4 *)local_aa0.data;
        if ((undefined4 *)local_aa0.data != (undefined4 *)0x0) {
          free(local_aa0.data);
        }
      }
      else {
        (*(local_aa0.allocator)->_vptr_Allocator[3])(local_aa0.allocator,local_aa0.data);
      }
    }
  }
  pvVar7->data = (void *)0x0;
  pvVar7->elemsize = 0;
  pvVar7->elempack = 0;
  pvVar7->dims = 0;
  pvVar7->w = 0;
  pvVar7->h = 0;
  pvVar7->d = 0;
  pvVar7->c = 0;
  pvVar7->cstep = 0;
  pvVar7->refcount = (int *)0x0;
  return local_a24;
}

Assistant:

int GRU::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Allocator* hidden_allocator = top_blobs.size() == 2 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 2)
    {
        hidden = bottom_blobs[1].clone(hidden_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = gru(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        int ret0 = gru(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        int ret1 = gru(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 2)
    {
        top_blobs[1] = hidden;
    }

    return 0;
}